

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

double __thiscall
despot::RockSampleParticleUpperBound2::Value(RockSampleParticleUpperBound2 *this,State *state)

{
  BaseRockSample *this_00;
  int iVar1;
  undefined8 uVar2;
  int rock;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_30;
  
  local_30 = 0.0;
  lVar3 = 0;
  while( true ) {
    this_00 = this->rs_model_;
    if (this_00->num_rocks_ <= lVar3) break;
    dVar4 = 10.0;
    if ((*(uint *)(state + 0xc) >> ((uint)lVar3 & 0x1f) & 1) == 0) {
      dVar4 = 0.0;
    }
    uVar2 = BaseRockSample::GetRobPos(this_00,state);
    iVar1 = despot::Coord::ManhattanDistance
                      (uVar2,*(undefined8 *)
                              ((this->rs_model_->rock_pos_).
                               super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3 * 8));
    dVar5 = pow(_ParticleBelief,(double)iVar1);
    local_30 = local_30 + dVar5 * dVar4;
    lVar3 = lVar3 + 1;
  }
  dVar4 = pow(_ParticleBelief,
              (double)(this_00->size_ -
                      (*(int *)(state + 0xc) >> ((byte)this_00->num_rocks_ & 0x1f)) %
                      (this_00->grid_).xsize_));
  return dVar4 * 10.0 + local_30;
}

Assistant:

double Value(const State& state) const {
		const RockSampleState& rockstate =
			static_cast<const RockSampleState&>(state);
		double value = 0;
		for (int rock = 0; rock < rs_model_->num_rocks_; rock++)
			value += 10.0 * rs_model_->GetRock(&rockstate, rock)
				* Globals::Discount(
					Coord::ManhattanDistance(rs_model_->GetRobPos(&rockstate),
						rs_model_->rock_pos_[rock]));
		value += 10.0
			* Globals::Discount(rs_model_->size_ - rs_model_->GetX(&rockstate));
		return value;
	}